

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O0

_Bool enque(chunk *chunk,queue *q)

{
  ulong uVar1;
  queue *q_local;
  chunk *chunk_local;
  
  if ((q->size == q->capacity) || (chunk == (chunk *)0x0)) {
    chunk_local._7_1_ = false;
  }
  else {
    q->size = q->size + 1;
    uVar1 = q->tail + 1;
    q->tail = uVar1;
    q->tail = uVar1 % q->capacity;
    q->elements[q->tail] = chunk;
    chunk_local._7_1_ = true;
  }
  return chunk_local._7_1_;
}

Assistant:

bool enque(chunk* chunk, queue* q)
{
    if (q->size == q->capacity || chunk == NULL) { return false; }
    else
    {
        q->size++;
        q->tail = (++q->tail) % q->capacity;
        q->elements[q->tail] = chunk;
    }

    return true;
}